

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void render_symbol(element_t *element,render_context_t *context,render_state_t *state,float x,
                  float y,float width,float height)

{
  _Bool _Var1;
  undefined1 local_78 [8];
  render_state_t new_state;
  float height_local;
  float width_local;
  float y_local;
  float x_local;
  render_state_t *state_local;
  render_context_t *context_local;
  element_t *element_local;
  
  if (((0.0 < width) && (0.0 < height)) &&
     (new_state.extents.w = height, new_state.extents.h = width, _Var1 = is_display_none(element),
     !_Var1)) {
    render_state_begin(element,(render_state_t *)local_78,state);
    new_state.mode = (render_mode_t)new_state.extents.h;
    new_state.opacity = new_state.extents.w;
    plutovg_matrix_translate((plutovg_matrix_t *)&new_state.view_width,x,y);
    apply_view_transform((render_state_t *)local_78,new_state.extents.h,new_state.extents.w);
    render_children(element,context,(render_state_t *)local_78);
    render_state_end((render_state_t *)local_78);
  }
  return;
}

Assistant:

static void render_symbol(const element_t* element, const render_context_t* context, render_state_t* state, float x, float y, float width, float height)
{
    if(width <= 0.f || height <= 0.f || is_display_none(element))
        return;
    render_state_t new_state;
    render_state_begin(element, &new_state, state);

    new_state.view_width = width;
    new_state.view_height = height;
    plutovg_matrix_translate(&new_state.matrix, x, y);

    apply_view_transform(&new_state, width, height);
    render_children(element, context, &new_state);
    render_state_end(&new_state);
}